

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reinsertion_optimizer.h
# Opt level: O3

void __thiscall
bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::
optimize<bvh::v2::ParallelExecutor>
          (ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *this,
          Executor<bvh::v2::ParallelExecutor> *executor,Config *config)

{
  pointer pNVar1;
  Index IVar2;
  Index IVar3;
  undefined8 uVar4;
  pointer puVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 auVar9 [16];
  sbyte sVar10;
  undefined8 uVar11;
  Candidate CVar12;
  unkbyte9 Var13;
  pointer pRVar14;
  _Bit_type *p_Var15;
  uint uVar16;
  long lVar17;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *pBVar18;
  long *plVar19;
  __normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion_*,_std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>_>
  _Var20;
  unsigned_long *puVar21;
  unsigned_long uVar22;
  pointer pNVar23;
  size_t sVar24;
  ulong uVar25;
  size_t i;
  ulong uVar26;
  _Bit_type *p_Var27;
  pointer pRVar28;
  size_type __n;
  __normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate_*,_std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>_>
  __last;
  __normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate_*,_std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>_>
  __first;
  unsigned_long uVar29;
  pointer pNVar30;
  ulong uVar31;
  byte bVar32;
  ulong uVar33;
  long lVar34;
  int *piVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_ZMM0 [64];
  float fVar39;
  vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
  candidates;
  _Iter_comp_iter<std::greater<void>_> __cmp;
  vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
  reinsertions;
  undefined1 local_108 [16];
  Candidate *local_f8;
  _Any_data local_e8;
  code *pcStack_d8;
  code *pcStack_d0;
  unsigned_long local_c8;
  unsigned_long local_c0;
  vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
  local_b8;
  Executor<bvh::v2::ParallelExecutor> *local_98;
  long local_90;
  unique_lock<std::mutex> local_88;
  undefined8 local_78;
  ulong local_70;
  vector<bool,_std::allocator<bool>_> local_68;
  Config *local_40;
  ulong local_38;
  
  __n = ((long)(this->bvh_->nodes).
               super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->bvh_->nodes).
               super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7;
  auVar9 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,__n);
  local_b8.
  super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8._M_pod_data[0] = '\0';
  lVar17 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar9._0_4_ * config->batch_size_ratio)));
  local_b8.
  super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
  ._M_impl.super__Vector_impl_data._M_start = (Reinsertion *)0x0;
  local_b8.
  super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Reinsertion *)0x0;
  local_70 = lVar17 + (ulong)(lVar17 == 0);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_68,__n,(bool *)local_e8._M_pod_data,(allocator_type *)&local_88);
  local_40 = config;
  if (config->max_iter_count != 0) {
    local_70 = local_70 + 1;
    uVar33 = 0;
    local_98 = executor;
    do {
      local_108 = ZEXT816(0) << 0x40;
      local_f8 = (Candidate *)0x0;
      uVar26 = ((long)(this->bvh_->nodes).
                      super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->bvh_->nodes).
                      super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7;
      if (local_70 < uVar26) {
        uVar26 = local_70;
      }
      local_38 = uVar33;
      if (uVar26 < 2) {
        __last._M_current = (Candidate *)0x0;
        __first._M_current = (Candidate *)0x0;
      }
      else {
        uVar33 = 1;
        lVar17 = 0x30;
        do {
          local_e8._M_pod_data[0] = (char)uVar33;
          local_e8._1_7_ = (undefined7)(uVar33 >> 8);
          pNVar23 = (this->bvh_->nodes).
                    super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          fVar39 = *(float *)((long)&pNVar23->bounds + lVar17 + -0x10) -
                   *(float *)((long)&pNVar23->bounds + lVar17 + -0x14);
          fVar8 = *(float *)((long)&pNVar23->bounds + lVar17 + -8) -
                  *(float *)((long)&pNVar23->bounds + lVar17 + -0xc);
          auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar39 * fVar8)),
                                   ZEXT416((uint)(*(float *)((long)&pNVar23->bounds + lVar17) -
                                                 *(float *)((long)&pNVar23->bounds + lVar17 + -4))),
                                   ZEXT416((uint)(fVar39 + fVar8)));
          local_e8._8_4_ = auVar9._0_4_;
          if ((Candidate *)local_108._8_8_ == local_f8) {
            std::
            vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate>>
            ::
            _M_realloc_insert<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate>
                      ((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate>>
                        *)local_108,(iterator)local_108._8_8_,(Candidate *)&local_e8);
          }
          else {
            CVar12.cost = (Scalar)local_e8._8_4_;
            CVar12.node_id = uVar33;
            CVar12._12_4_ = local_e8._12_4_;
            *(Candidate *)local_108._8_8_ = CVar12;
            local_108._8_8_ = (Candidate *)(local_108._8_8_ + 0x10);
          }
          uVar33 = uVar33 + 1;
          lVar17 = lVar17 + 0x1c;
        } while (uVar26 != uVar33);
        __last._M_current = (Candidate *)local_108._8_8_;
        __first._M_current = (Candidate *)local_108._0_8_;
        executor = local_98;
      }
      std::
      __make_heap<__gnu_cxx::__normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate*,std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
                (__first,__last,(_Iter_comp_iter<std::greater<void>_> *)local_e8._M_pod_data);
      pBVar18 = this->bvh_;
      pNVar23 = (pBVar18->nodes).
                super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      for (; uVar16 = local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset,
          p_Var15 = local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p,
          uVar26 < (ulong)(((long)(pBVar18->nodes).
                                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar23 >> 2) *
                          0x6db6db6db6db6db7); uVar26 = uVar26 + 1) {
        fVar39 = *(float *)((long)(pNVar23 + uVar26) + 4) - pNVar23[uVar26].bounds._M_elems[0];
        fVar8 = *(float *)((long)(pNVar23 + uVar26) + 0xc) -
                *(float *)((long)(pNVar23 + uVar26) + 8);
        auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar39 * fVar8)),
                                 ZEXT416((uint)(*(float *)((long)(pNVar23 + uVar26) + 0x14) -
                                               *(float *)((long)(pNVar23 + uVar26) + 0x10))),
                                 ZEXT416((uint)(fVar39 + fVar8)));
        fVar39 = auVar9._0_4_;
        if (*(float *)(local_108._0_8_ + 8) < fVar39) {
          lVar17 = local_108._8_8_ - local_108._0_8_;
          if (0x10 < lVar17) {
            uVar4 = *(undefined8 *)(local_108._8_8_ + -0x10);
            local_90 = CONCAT44(local_90._4_4_,fVar39);
            *(undefined8 *)(local_108._8_8_ + -0x10) = *(undefined8 *)local_108._0_8_;
            *(undefined4 *)(local_108._8_8_ + -8) = *(undefined4 *)(local_108._0_8_ + 8);
            std::
            __adjust_heap<__gnu_cxx::__normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate*,std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate>>>,long,bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
                      (local_108._0_8_,0,(local_108._8_8_ + -0x10) - local_108._0_8_ >> 4,uVar4);
            lVar17 = local_108._8_8_ - local_108._0_8_;
            fVar39 = (float)local_90;
          }
          *(ulong *)(local_108._8_8_ + -0x10) = uVar26;
          *(float *)(local_108._8_8_ + -8) = fVar39;
          uVar33 = (lVar17 >> 4) - 1;
          if (1 < lVar17 >> 4) {
            do {
              uVar31 = uVar33 - 1;
              uVar25 = uVar31 >> 1;
              if (*(float *)(local_108._0_8_ + (uVar25 * 2 + 1) * 8) <= fVar39) goto LAB_0010f114;
              *(undefined4 *)(local_108._0_8_ + (uVar33 * 2 + 1) * 8) =
                   *(undefined4 *)((undefined8 *)(local_108._0_8_ + uVar25 * 2 * 8) + 1);
              *(undefined8 *)(local_108._0_8_ + uVar33 * 2 * 8) =
                   *(undefined8 *)(local_108._0_8_ + uVar25 * 2 * 8);
              uVar33 = uVar25;
            } while (1 < uVar31);
            uVar33 = 0;
          }
LAB_0010f114:
          *(ulong *)(local_108._0_8_ + uVar33 * 2 * 8) = uVar26;
          *(float *)(local_108._0_8_ + (uVar33 * 2 + 1) * 8) = fVar39;
          pBVar18 = this->bvh_;
          pNVar23 = (pBVar18->nodes).
                    super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
      }
      p_Var27 = local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p;
      if (local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p !=
          local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p) {
        memset(local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p,0,
               (long)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
               (long)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        p_Var27 = p_Var15;
      }
      if (uVar16 != 0) {
        bVar32 = (byte)uVar16;
        sVar10 = (bVar32 < 0x41) * ('@' - bVar32);
        *p_Var27 = *p_Var27 & ~((ulong)(-1L << sVar10) >> sVar10);
      }
      std::
      vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
      ::resize(&local_b8,(long)(local_108._8_8_ - local_108._0_8_) >> 4);
      uVar33 = (long)(local_108._8_8_ - local_108._0_8_) >> 4;
      if (uVar33 < *(ulong *)(executor + 8)) {
        if (local_108._8_8_ != local_108._0_8_) {
          lVar17 = 0;
          lVar34 = 0;
          do {
            find_reinsertion((Reinsertion *)&local_e8,this,*(size_t *)(local_108._0_8_ + lVar17));
            lVar17 = lVar17 + 0x10;
            *(undefined4 *)
             ((long)&(local_b8.
                      super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                      ._M_impl.super__Vector_impl_data._M_start)->area_diff + lVar34) =
                 pcStack_d8._0_4_;
            auVar9._1_7_ = local_e8._1_7_;
            auVar9[0] = local_e8._M_pod_data[0];
            auVar9._8_4_ = local_e8._8_4_;
            auVar9._12_4_ = local_e8._12_4_;
            *(undefined1 (*) [16])
             ((long)&(local_b8.
                      super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                      ._M_impl.super__Vector_impl_data._M_start)->from + lVar34) = auVar9;
            lVar34 = lVar34 + 0x18;
            uVar33 = uVar33 - 1;
          } while (uVar33 != 0);
        }
      }
      else {
        piVar35 = *(int **)executor;
        uVar26 = uVar33 / (ulong)(*(long *)(piVar35 + 0xe) - *(long *)(piVar35 + 0xc) >> 3);
        local_90 = uVar26 + (uVar26 == 0);
        if (local_108._8_8_ != local_108._0_8_) {
          uVar26 = 0;
          do {
            lVar17 = *(long *)local_98;
            local_e8._M_pod_data[0] = '\0';
            local_e8._1_7_ = 0;
            local_e8._8_4_ = 0;
            local_e8._12_4_ = 0;
            pcStack_d8 = (code *)0x0;
            pcStack_d0 = (code *)0x0;
            plVar19 = (long *)operator_new(0x28);
            local_e8._M_pod_data[0] = (char)plVar19;
            local_e8._1_7_ = (undefined7)((ulong)plVar19 >> 8);
            *plVar19 = (long)&local_b8;
            plVar19[1] = (long)this;
            plVar19[2] = (long)local_108;
            plVar19[3] = uVar26;
            uVar26 = uVar26 + local_90;
            uVar31 = uVar33;
            if (uVar26 < uVar33) {
              uVar31 = uVar26;
            }
            plVar19[4] = uVar31;
            pcStack_d0 = std::
                         _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
                         ::_M_invoke;
            local_88._M_device = (mutex_type *)(lVar17 + 8);
            pcStack_d8 = std::
                         _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
                         ::_M_manager;
            local_88._M_owns = false;
            std::unique_lock<std::mutex>::lock(&local_88);
            local_88._M_owns = true;
            std::
            deque<std::function<void(unsigned_long)>,std::allocator<std::function<void(unsigned_long)>>>
            ::emplace_back<std::function<void(unsigned_long)>>
                      ((deque<std::function<void(unsigned_long)>,std::allocator<std::function<void(unsigned_long)>>>
                        *)(lVar17 + 0xa8),(function<void_(unsigned_long)> *)&local_e8);
            std::unique_lock<std::mutex>::~unique_lock(&local_88);
            std::condition_variable::notify_one();
            if (pcStack_d8 != (code *)0x0) {
              (*pcStack_d8)(&local_e8,&local_e8,__destroy_functor);
            }
          } while (uVar26 < uVar33);
          piVar35 = *(int **)local_98;
        }
        local_e8._M_pod_data[0] = (char)(piVar35 + 2);
        local_e8._1_7_ = (undefined7)((ulong)(piVar35 + 2) >> 8);
        local_e8._8_4_ = local_e8._8_4_ & 0xffffff00;
        std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_e8);
        local_e8._M_pod_data[8] = 1;
        while ((*piVar35 != 0 || (*(long *)(piVar35 + 0x36) != *(long *)(piVar35 + 0x2e)))) {
          std::condition_variable::wait((unique_lock *)(piVar35 + 0x1e));
        }
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_e8);
      }
      _Var20 = std::
               __remove_if<__gnu_cxx::__normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion*,std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion>>>,__gnu_cxx::__ops::_Iter_pred<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::optimize<bvh::v2::ParallelExecutor>(bvh::v2::Executor<bvh::v2::ParallelExecutor>&,bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Config_const&)::_lambda(auto:1&)_1_>>
                         (local_b8.
                          super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      executor = local_98;
      pRVar14 = local_b8.
                super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (_Var20._M_current !=
          local_b8.
          super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_b8.
        super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Var20;
      }
      if (local_b8.
          super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_b8.
          super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion*,std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
                  (local_b8.
                   super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_b8.
                   super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (int)LZCOUNT(((long)local_b8.
                                       super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_b8.
                                       super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                -0x5555555555555555) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion*,std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
                  (pRVar14);
        pRVar14 = local_b8.
                  super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pRVar28 = local_b8.
                       super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                       ._M_impl.super__Vector_impl_data._M_start; pRVar28 != pRVar14;
            pRVar28 = pRVar28 + 1) {
          uVar33 = pRVar28->from;
          sVar24 = pRVar28->to;
          local_e8._M_pod_data[0] = (char)sVar24;
          local_e8._1_7_ = (undefined7)(sVar24 >> 8);
          local_e8._8_4_ = (undefined4)uVar33;
          local_e8._12_4_ = (undefined4)(uVar33 >> 0x20);
          pcStack_d8 = (code *)((-(ulong)((uVar33 & 1) == 0) | 1) + uVar33);
          puVar5 = (this->parents_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pcStack_d0 = (code *)puVar5[sVar24];
          local_c8 = puVar5[uVar33];
          puVar21 = std::
                    __find_if<unsigned_long*,__gnu_cxx::__ops::_Iter_pred<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::optimize<bvh::v2::ParallelExecutor>(bvh::v2::Executor<bvh::v2::ParallelExecutor>&,bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Config_const&)::_lambda(unsigned_long)_1_>>
                              (&local_e8,&local_c0,&local_68);
          if (puVar21 == &local_c0) {
            lVar17 = 0;
            do {
              uVar33 = *(ulong *)((long)&local_e8 + lVar17);
              uVar26 = uVar33 + 0x3f;
              if (-1 < (long)uVar33) {
                uVar26 = uVar33;
              }
              lVar17 = lVar17 + 8;
              local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p
              [((long)uVar26 >> 6) +
               ((ulong)((uVar33 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
                   local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)uVar26 >> 6) +
                    ((ulong)((uVar33 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                   1L << (uVar33 & 0x3f);
            } while (lVar17 != 0x28);
            uVar33 = pRVar28->from;
            sVar24 = pRVar28->to;
            pNVar30 = (this->bvh_->nodes).
                      super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar22 = (this->parents_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar33];
            uVar26 = (ulong)((uVar33 & 1) == 0);
            uVar31 = uVar33 - uVar26;
            uVar29 = (-uVar26 | 1) + uVar33;
            local_78 = *(undefined8 *)((long)(pNVar30 + uVar29) + 0x10);
            pNVar23 = pNVar30 + uVar29;
            local_88._M_device = *(mutex_type **)&pNVar23->bounds;
            lVar17 = *(long *)((long)&pNVar23->bounds + 8);
            Var13 = *(unkbyte9 *)&pNVar23->bounds;
            local_88._M_owns = SUB81(lVar17,0);
            local_88._9_7_ = SUB87((ulong)lVar17 >> 8,0);
            if (0xfffffff < uVar31) {
              __assert_fail("first_id <= static_cast<size_t>(max_first_id)",
                            "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/index.h"
                            ,0x4f,
                            "bvh::v2::Index<32, 4>::Index(size_t, size_t) [Bits = 32, PrimCountBits = 4]"
                           );
            }
            pNVar23 = pNVar30 + uVar29;
            IVar2.value = ((Index *)((long)(pNVar30 + uVar29) + 0x18))->value;
            pNVar1 = pNVar30 + sVar24;
            IVar3.value = ((Index *)((long)(pNVar30 + sVar24) + 0x18))->value;
            (pNVar1->index).value = (int)uVar31 << 4;
            uVar4 = *(undefined8 *)&pNVar1->bounds;
            uVar11 = *(undefined8 *)((long)&pNVar1->bounds + 8);
            *(undefined8 *)((long)&pNVar23->bounds + 0x10) =
                 *(undefined8 *)((long)&pNVar1->bounds + 0x10);
            *(undefined8 *)&pNVar23->bounds = uVar4;
            *(undefined8 *)((long)&pNVar23->bounds + 8) = uVar11;
            (pNVar23->index).value = IVar3.value;
            pNVar23 = (this->bvh_->nodes).
                      super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(undefined8 *)((long)(pNVar23 + uVar22) + 0x10) = local_78;
            auVar36._9_7_ = local_88._9_7_;
            auVar36._0_9_ = Var13;
            *(undefined1 (*) [16])&pNVar23[uVar22].bounds = auVar36;
            ((Index *)((long)(pNVar23 + uVar22) + 0x18))->value = IVar2.value;
            if ((IVar3.value & 0xf) == 0) {
              puVar5 = (this->parents_).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar5[IVar3.value >> 4] = uVar29;
              puVar5[(ulong)(IVar3.value >> 4) + 1] = uVar29;
            }
            if ((IVar2.value & 0xf) == 0) {
              puVar5 = (this->parents_).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar5[IVar2.value >> 4] = uVar22;
              puVar5[(ulong)(IVar2.value >> 4) + 1] = uVar22;
            }
            puVar5 = (this->parents_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar5[uVar29] = sVar24;
            puVar5[uVar33] = sVar24;
            pNVar23 = (this->bvh_->nodes).
                      super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              IVar2.value = ((Index *)((long)(pNVar23 + sVar24) + 0x18))->value;
              if ((IVar2.value & 0xf) == 0) {
                uVar33 = (ulong)(IVar2.value >> 4);
                pNVar30 = pNVar23 + sVar24;
                auVar9 = vminss_avx(ZEXT416(*(uint *)&pNVar23[uVar33].bounds),
                                    ZEXT416(*(uint *)&pNVar23[uVar33 + 1].bounds));
                auVar7 = vmaxss_avx(ZEXT416((uint)*(float *)((long)(pNVar23 + uVar33) + 0x14)),
                                    ZEXT416((uint)*(float *)((long)(pNVar23 + uVar33 + 1) + 0x14)));
                *(int *)&pNVar30->bounds = auVar9._0_4_;
                auVar36 = vgatherdps_avx512vl(*(undefined4 *)
                                               ((long)&pNVar23->bounds +
                                               (long)&pNVar23[uVar33].bounds));
                auVar37 = vgatherdps_avx512vl(*(undefined4 *)
                                               ((long)&pRVar28->from + (long)&pNVar23[uVar33].bounds
                                               ));
                uVar33 = vcmpps_avx512vl(auVar37,auVar36,1);
                auVar9 = vblendps_avx(auVar36,auVar37,10);
                auVar36 = vblendps_avx(auVar37,auVar36,10);
                bVar6 = (bool)((byte)uVar33 & 1);
                auVar37._0_4_ = (uint)bVar6 * auVar9._0_4_ | (uint)!bVar6 * auVar36._0_4_;
                bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
                auVar37._4_4_ = (uint)bVar6 * auVar9._4_4_ | (uint)!bVar6 * auVar36._4_4_;
                bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
                auVar37._8_4_ = (uint)bVar6 * auVar9._8_4_ | (uint)!bVar6 * auVar36._8_4_;
                bVar6 = (bool)((byte)(uVar33 >> 3) & 1);
                auVar37._12_4_ = (uint)bVar6 * auVar9._12_4_ | (uint)!bVar6 * auVar36._12_4_;
                *(undefined1 (*) [16])((long)&pNVar30->bounds + 4) = auVar37;
                *(float *)((long)&pNVar30->bounds + 0x14) = auVar7._0_4_;
              }
              sVar24 = puVar5[sVar24];
            } while (sVar24 != 0);
            do {
              IVar2.value = ((Index *)((long)(pNVar23 + uVar22) + 0x18))->value;
              if ((IVar2.value & 0xf) == 0) {
                uVar33 = (ulong)(IVar2.value >> 4);
                pNVar30 = pNVar23 + uVar22;
                auVar9 = vminss_avx(ZEXT416(*(uint *)&pNVar23[uVar33].bounds),
                                    ZEXT416(*(uint *)&pNVar23[uVar33 + 1].bounds));
                auVar7 = vmaxss_avx(ZEXT416((uint)*(float *)((long)(pNVar23 + uVar33) + 0x14)),
                                    ZEXT416((uint)*(float *)((long)(pNVar23 + uVar33 + 1) + 0x14)));
                *(int *)&pNVar30->bounds = auVar9._0_4_;
                auVar36 = vgatherdps_avx512vl(*(undefined4 *)
                                               ((long)&pNVar23->bounds +
                                               (long)&pNVar23[uVar33].bounds));
                auVar37 = vgatherdps_avx512vl(*(undefined4 *)
                                               ((long)&pRVar28->from + (long)&pNVar23[uVar33].bounds
                                               ));
                uVar33 = vcmpps_avx512vl(auVar37,auVar36,1);
                auVar9 = vblendps_avx(auVar36,auVar37,10);
                auVar36 = vblendps_avx(auVar37,auVar36,10);
                bVar6 = (bool)((byte)uVar33 & 1);
                auVar38._0_4_ = (uint)bVar6 * auVar9._0_4_ | (uint)!bVar6 * auVar36._0_4_;
                bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
                auVar38._4_4_ = (uint)bVar6 * auVar9._4_4_ | (uint)!bVar6 * auVar36._4_4_;
                bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
                auVar38._8_4_ = (uint)bVar6 * auVar9._8_4_ | (uint)!bVar6 * auVar36._8_4_;
                bVar6 = (bool)((byte)(uVar33 >> 3) & 1);
                auVar38._12_4_ = (uint)bVar6 * auVar9._12_4_ | (uint)!bVar6 * auVar36._12_4_;
                *(undefined1 (*) [16])((long)&pNVar30->bounds + 4) = auVar38;
                *(float *)((long)&pNVar30->bounds + 0x14) = auVar7._0_4_;
              }
              uVar22 = puVar5[uVar22];
            } while (uVar22 != 0);
          }
        }
      }
      uVar33 = local_38;
      if ((void *)local_108._0_8_ != (void *)0x0) {
        operator_delete((void *)local_108._0_8_,(long)local_f8 - local_108._0_8_);
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 < local_40->max_iter_count);
  }
  if (local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (ulong *)0x0;
  }
  if (local_b8.
      super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
      ._M_impl.super__Vector_impl_data._M_start != (Reinsertion *)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void optimize(Executor<Derived>& executor, const Config& config) {
        auto batch_size = std::max(size_t{1},
            static_cast<size_t>(static_cast<Scalar>(bvh_.nodes.size()) * config.batch_size_ratio));
        std::vector<Reinsertion> reinsertions;
        std::vector<bool> touched(bvh_.nodes.size());

        for (size_t iter = 0; iter < config.max_iter_count; ++iter) {
            auto candidates = find_candidates(batch_size);

            std::fill(touched.begin(), touched.end(), false);
            reinsertions.resize(candidates.size());
            executor.for_each(0, candidates.size(),
                [&] (size_t begin, size_t end) {
                    for (size_t i = begin; i < end; ++i)
                        reinsertions[i] = find_reinsertion(candidates[i].node_id);
                });

            reinsertions.erase(std::remove_if(reinsertions.begin(), reinsertions.end(),
                [] (auto& r) { return r.area_diff <= 0; }), reinsertions.end());
            std::sort(reinsertions.begin(), reinsertions.end(), std::greater<>{});

            for (auto& reinsertion : reinsertions) {
                auto conflicts = get_conflicts(reinsertion.from, reinsertion.to);
                if (std::any_of(conflicts.begin(), conflicts.end(), [&] (size_t i) { return touched[i]; }))
                    continue;
                for (auto conflict : conflicts)
                    touched[conflict] = true;
                reinsert_node(reinsertion.from, reinsertion.to);
            }
        }
    }